

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O3

AssertionResult * __thiscall
iutest::internal::
CmpHelperOpFailure<iutest::detail::iu_basic_string_view<char,std::char_traits<char>>,char[4]>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expr1,char *expr2,char *op,
          iu_basic_string_view<char,_std::char_traits<char>_> *val1,char (*val2) [4])

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  AssertionResult *pAVar3;
  char *local_218;
  char *local_210;
  internal *local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  AssertionResult local_1e0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [376];
  
  paVar1 = &local_1e0.m_message.field_2;
  local_1e0.m_message._M_string_length = 0;
  local_1e0.m_message.field_2._M_local_buf[0] = '\0';
  local_1e0.m_result = false;
  local_218 = expr2;
  local_210 = expr1;
  local_208 = this;
  local_1e0.m_message._M_dataplus._M_p = (pointer)paVar1;
  pAVar3 = AssertionResult::operator<<(&local_1e0,(char (*) [18])"error: Expected: ");
  pAVar3 = AssertionResult::operator<<(pAVar3,(char **)&local_208);
  pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x12b390);
  pAVar3 = AssertionResult::operator<<(pAVar3,&local_218);
  pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x12b390);
  pAVar3 = AssertionResult::operator<<(pAVar3,&local_210);
  pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [12])"\n  Actual: ");
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1b8);
  detail::PrintTo<char,std::char_traits<char>>
            ((iu_basic_string_view<char,_std::char_traits<char>_> *)op,(iu_ostream *)local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  pAVar3 = AssertionResult::operator<<(pAVar3,&local_200);
  pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [5])" vs ");
  PrintToString<char[4]>((string *)local_1b8,(char (*) [4])val1);
  pAVar3 = AssertionResult::operator<<
                     (pAVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1b8);
  (__return_storage_ptr__->m_message)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_message).field_2;
  pcVar2 = (pAVar3->m_message)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pAVar3->m_message)._M_string_length);
  __return_storage_ptr__->m_result = pAVar3->m_result;
  if ((iu_ostream *)local_1b8._0_8_ != (iu_ostream *)local_1a8) {
    operator_delete((void *)local_1b8._0_8_,local_1a8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0.m_message._M_dataplus._M_p,
                    CONCAT71(local_1e0.m_message.field_2._M_allocated_capacity._1_7_,
                             local_1e0.m_message.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult CmpHelperOpFailure(const char* expr1, const char* expr2, const char* op
    , const T1& val1, const T2& val2)
{
    return AssertionFailure() << "error: Expected: " << expr1 << " " << op << " " << expr2
        << "\n  Actual: " << FormatForComparisonFailureMessage(val1, val2)
        << " vs " << FormatForComparisonFailureMessage(val2, val1);
}